

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2Reference(void *ctx,xmlChar *name)

{
  xmlNodePtr cur;
  xmlNodePtr pxVar1;
  
  if (ctx != (void *)0x0) {
    if (*name == '#') {
      cur = xmlNewCharRef(*(xmlDocPtr *)((long)ctx + 0x10),name);
    }
    else {
      cur = xmlNewReference(*(xmlDocPtr *)((long)ctx + 0x10),name);
    }
    pxVar1 = xmlAddChild(*(xmlNodePtr *)((long)ctx + 0x50),cur);
    if (pxVar1 == (xmlNodePtr)0x0) {
      xmlFreeNode(cur);
      return;
    }
  }
  return;
}

Assistant:

void
xmlSAX2Reference(void *ctx, const xmlChar *name)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;

    if (ctx == NULL) return;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2Reference(%s)\n", name);
#endif
    if (name[0] == '#')
	ret = xmlNewCharRef(ctxt->myDoc, name);
    else
	ret = xmlNewReference(ctxt->myDoc, name);
#ifdef DEBUG_SAX_TREE
    xmlGenericError(xmlGenericErrorContext,
	    "add xmlSAX2Reference %s to %s \n", name, ctxt->node->name);
#endif
    if (xmlAddChild(ctxt->node, ret) == NULL) {
        xmlFreeNode(ret);
    }
}